

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.hpp
# Opt level: O2

void __thiscall glu::StructMember::~StructMember(StructMember *this)

{
  VarType::~VarType(&this->m_type);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

StructMember	(const char* name, const VarType& type) : m_name(name), m_type(type) {}